

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O2

int exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
              (float minimum_uniform,byte update_zero_elements,long pdf_first,long pdf_last)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  uVar3 = *(ulong *)(pdf_first + 8);
  uVar4 = *(ulong *)(pdf_last + 8);
  if (uVar4 < uVar3 || uVar4 - uVar3 == 0) {
    iVar2 = 1;
  }
  else {
    uVar7 = (long)(uVar4 - uVar3) >> 3;
    if (0.999 < minimum_uniform) {
      uVar5 = uVar3;
      if (update_zero_elements == 0) {
        for (; uVar5 != uVar4; uVar5 = uVar5 + 8) {
          uVar7 = uVar7 - (-(uint)(*(float *)(uVar5 + 4) == 0.0) & 1);
        }
      }
      for (; uVar3 != uVar4; uVar3 = uVar3 + 8) {
        if ((update_zero_elements != 0) || (0.0 < *(float *)(uVar3 + 4))) {
          *(float *)(uVar3 + 4) = 1.0 / (float)uVar7;
          uVar4 = *(ulong *)(pdf_last + 8);
        }
      }
      return 0;
    }
    minimum_uniform = minimum_uniform / (float)uVar7;
    uVar6 = 0;
    fVar9 = 0.0;
    fVar8 = 0.0;
    for (; uVar3 != uVar4; uVar3 = uVar3 + 8) {
      fVar1 = *(float *)(uVar3 + 4);
      if (((fVar1 <= 0.0) && (fVar1 != 0.0 || (update_zero_elements ^ 1) != 0)) ||
         (minimum_uniform < fVar1)) {
        fVar8 = fVar8 + fVar1;
      }
      else {
        fVar9 = fVar9 + minimum_uniform;
        *(float *)(uVar3 + 4) = minimum_uniform;
        uVar6 = uVar6 + 1;
        uVar4 = *(ulong *)(pdf_last + 8);
      }
    }
    iVar2 = 0;
    if (0.0 < fVar9) {
      if (fVar9 <= 0.999) {
        for (uVar3 = *(ulong *)(pdf_first + 8); uVar3 != uVar4; uVar3 = uVar3 + 8) {
          if (minimum_uniform < *(float *)(uVar3 + 4)) {
            *(float *)(uVar3 + 4) = *(float *)(uVar3 + 4) * ((1.0 - fVar9) / fVar8);
            uVar4 = *(ulong *)(pdf_last + 8);
          }
        }
      }
      else {
        fVar8 = (1.0 - fVar8) / (float)uVar6;
        for (uVar3 = *(ulong *)(pdf_first + 8); uVar3 != uVar4; uVar3 = uVar3 + 8) {
          fVar9 = *(float *)(uVar3 + 4);
          if (((0.0 < fVar9) || (fVar9 == 0.0 && (update_zero_elements ^ 1) == 0)) &&
             (fVar9 <= fVar8)) {
            *(float *)(uVar3 + 4) = fVar8;
            uVar4 = *(ulong *)(pdf_last + 8);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

bool operator!=(const score_iterator& other) const { return _p != other._p; }